

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_fork_server.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  size_t len;
  mbedtls_net_context listen_fd;
  mbedtls_net_context client_fd;
  mbedtls_pk_context pkey;
  mbedtls_ssl_context ssl;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_ssl_config conf;
  mbedtls_x509_crt srvcert;
  uchar buf [1024];
  mbedtls_entropy_context entropy;
  mbedtls_net_context local_f00;
  mbedtls_net_context local_efc;
  mbedtls_pk_context local_ef8;
  mbedtls_ssl_context local_ee8;
  mbedtls_ctr_drbg_context local_d30;
  mbedtls_ssl_config local_bd8;
  mbedtls_x509_crt local_a60;
  uchar local_838 [1032];
  mbedtls_entropy_context local_430;
  
  mbedtls_net_init(&local_f00);
  mbedtls_net_init(&local_efc);
  mbedtls_ssl_init(&local_ee8);
  mbedtls_ssl_config_init(&local_bd8);
  mbedtls_entropy_init(&local_430);
  mbedtls_pk_init(&local_ef8);
  mbedtls_x509_crt_init(&local_a60);
  mbedtls_ctr_drbg_init(&local_d30);
  signal(0x11,(__sighandler_t)0x1);
  printf("\n  . Initial seeding of the random generator...");
  fflush(_stdout);
  uVar1 = mbedtls_ctr_drbg_seed
                    (&local_d30,mbedtls_entropy_func,&local_430,(uchar *)"ssl_fork_server",0xf);
  if (uVar1 == 0) {
    puts(" ok");
    printf("  . Loading the server cert. and key...");
    fflush(_stdout);
    uVar1 = mbedtls_x509_crt_parse(&local_a60,(uchar *)mbedtls_test_srv_crt,0x4ad);
    if ((uVar1 == 0) &&
       (uVar1 = mbedtls_x509_crt_parse
                          (&local_a60,
                           (uchar *)
                           "-----BEGIN CERTIFICATE-----\r\nMIIDhzCCAm+gAwIBAgIBADANBgkqhkiG9w0BAQUFADA7MQswCQYDVQQGEwJOTDER\r\nMA8GA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwHhcN\r\nMTEwMjEyMTQ0NDAwWhcNMjEwMjEyMTQ0NDAwWjA7MQswCQYDVQQGEwJOTDERMA8G\r\nA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwggEiMA0G\r\nCSqGSIb3DQEBAQUAA4IBDwAwggEKAoIBAQDA3zf8F7vglp0/ht6WMn1EpRagzSHx\r\nmdTs6st8GFgIlKXsm8WL3xoemTiZhx57wI053zhdcHgH057Zk+i5clHFzqMwUqny\r\n50BwFMtEonILwuVA+T7lpg6z+exKY8C4KQB0nFc7qKUEkHHxvYPZP9al4jwqj+8n\r\nYMPGn8u67GB9t+aEMr5P+1gmIgNb1LTV+/Xjli5wwOQuvfwu7uJBVcA0Ln0kcmnL\r\nR7EUQIN9Z/SG9jGr8XmksrUuEvmEF/Bibyc+E1ixVA0hmnM3oTDPb5Lc9un8rNsu\r\nKNF+AksjoBXyOGVkCeoMbo4bF6BxyLObyavpw/LPh5aPgAIynplYb6LVAgMBAAGj\r\ngZUwgZIwDAYDVR0TBAUwAwEB/zAdBgNVHQ4EFgQUtFrkpbPe0lL2udWmlQ/rPrzH\r\n/f8wYwYDVR0jBFwwWoAUtFrkpbPe0lL2udWmlQ/rPrzH/f+hP6Q9MDsxCzAJBgNV\r\nBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEZMBcGA1UEAxMQUG9sYXJTU0wgVGVz\r\ndCBDQYIBADANBgkqhkiG9w0BAQUFAAOCAQEAuP1U2ABUkIslsCfdlc2i94QHHYeJ\r\nSsR4EdgHtdciUI5I62J6Mom+Y0dT/7a+8S6MVMCZP6C5NyNyXw1GWY/YR82XTJ8H\r\nDBJiCTok5DbZ6SzaONBzdWHXwWwmi5vg1dxn7YxrM9d0IjxM27WNKs4sDQhZBQkF\r\npjmfs2cb4oPl4Y9T9meTx/lvdkRYEug61Jfn6cA+qHpyPYdTH+UshITnmp5/Ztkf\r\nm/UTSLBNFNHesiTZeH31NcxYGdHSme9Nc/gfidRa0FLOCfWxRlFqAI47zG9jAQCZ\r\n7Z2mCGDNMhjQc+BYcdnl0lPXjdDK6V0qCg1dVewhUBcW5gZKzV7e9+DpVA==\r\n-----END CERTIFICATE-----\r\n-----BEGIN CERTIFICATE-----\r\nMIICUjCCAdegAwIBAgIJAMFD4n5iQ8zoMAoGCCqGSM49BAMCMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTAeFw0xMzA5MjQxNTQ5NDhaFw0yMzA5MjIxNTQ5NDhaMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTB2MBAGByqGSM49AgEGBSuBBAAiA2IABMPaKzRBN1gvh1b+/Im6KUNLTuBu\r\nww5XUzM5WNRStJGVOQsj318XJGJI/BqVKc4sLYfCiFKAr9ZqqyHduNMcbli4yuiy\r\naY7zQa0pw7RfdadHb9UZKVVpmlM7ILRmFmAzHqOBoDCBnTAdBgNVHQ4EFgQUnW0g\r\nJEkBPyvLeLUZvH4kydv7NnwwbgYDVR0jBGcwZYAUnW0gJEkBPyvLeLUZvH4kydv7\r\nNnyhQqRAMD4xCzAJBgNVBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UE\r\nAxMTUG9sYXJzc2wgVGVzdCBFQyBDQYIJAMFD4n5iQ8zoMAwGA1UdEwQFMAMBAf8w\r\nCgYIKoZIzj0EAwIDaQAwZgIxAMO0YnNWKJUAfXgSJtJxexn4ipg+k..." /* TRUNCATED STRING LITERAL */
                           ,0x88d), uVar1 == 0)) {
      uVar1 = mbedtls_pk_parse_key(&local_ef8,(uchar *)mbedtls_test_srv_key,0x6ab,(uchar *)0x0,0);
      if (uVar1 == 0) {
        puts(" ok");
        printf("  . Configuring SSL...");
        fflush(_stdout);
        uVar1 = mbedtls_ssl_config_defaults(&local_bd8,1,0,0);
        if (uVar1 == 0) {
          mbedtls_ssl_conf_rng(&local_bd8,mbedtls_ctr_drbg_random,&local_d30);
          mbedtls_ssl_conf_dbg(&local_bd8,my_debug,_stdout);
          mbedtls_ssl_conf_ca_chain(&local_bd8,local_a60.next,(mbedtls_x509_crl *)0x0);
          uVar1 = mbedtls_ssl_conf_own_cert(&local_bd8,&local_a60,&local_ef8);
          if (uVar1 == 0) {
            puts(" ok");
            printf("  . Bind on https://localhost:4433/ ...");
            fflush(_stdout);
            uVar1 = mbedtls_net_bind(&local_f00,(char *)0x0,"4433",0);
            if (uVar1 == 0) {
              puts(" ok");
              do {
                mbedtls_net_init(&local_efc);
                mbedtls_ssl_init(&local_ee8);
                puts("  . Waiting for a remote connection ...");
                fflush(_stdout);
                uVar1 = mbedtls_net_accept(&local_f00,&local_efc,(void *)0x0,0,(size_t *)0x0);
                if (uVar1 != 0) {
                  pcVar3 = " failed!  mbedtls_net_accept returned %d\n\n";
                  uVar2 = uVar1;
                  goto LAB_0010f613;
                }
                printf("  . Forking to handle connection ...");
                fflush(_stdout);
                uVar2 = fork();
                if ((int)uVar2 < 0) {
                  pcVar3 = " failed!  fork returned %d\n\n";
                  uVar1 = 0;
                  goto LAB_0010f613;
                }
                if (uVar2 == 0) {
                  mbedtls_net_init(&local_f00);
                  uVar2 = getpid();
                  printf("pid %d: Setting up the SSL data.\n",(ulong)uVar2);
                  fflush(_stdout);
                  uVar1 = mbedtls_ctr_drbg_reseed(&local_d30,(uchar *)"child",5);
                  if (uVar1 != 0) {
                    pcVar3 = "pid %d: SSL setup failed!  mbedtls_ctr_drbg_reseed returned %d\n\n";
                    goto LAB_0010fb08;
                  }
                  uVar1 = mbedtls_ssl_setup(&local_ee8,&local_bd8);
                  if (uVar1 == 0) {
                    mbedtls_ssl_set_bio(&local_ee8,&local_efc,mbedtls_net_send,mbedtls_net_recv,
                                        (mbedtls_ssl_recv_timeout_t *)0x0);
                    printf("pid %d: SSL setup ok\n",(ulong)uVar2);
                    printf("pid %d: Performing the SSL/TLS handshake.\n",(ulong)uVar2);
                    fflush(_stdout);
                    goto LAB_0010f956;
                  }
                  pcVar3 = "pid %d: SSL setup failed!  mbedtls_ssl_setup returned %d\n\n";
                  goto LAB_0010fb08;
                }
                puts(" ok");
                uVar1 = mbedtls_ctr_drbg_reseed(&local_d30,(uchar *)"parent",6);
              } while (uVar1 == 0);
              pcVar3 = " failed!  mbedtls_ctr_drbg_reseed returned %d\n\n";
              uVar2 = uVar1;
            }
            else {
              pcVar3 = " failed!  mbedtls_net_bind returned %d\n\n";
              uVar2 = uVar1;
            }
          }
          else {
            pcVar3 = " failed!  mbedtls_ssl_conf_own_cert returned %d\n\n";
            uVar2 = uVar1;
          }
        }
        else {
          pcVar3 = " failed!  mbedtls_ssl_config_defaults returned %d\n\n";
          uVar2 = uVar1;
        }
      }
      else {
        pcVar3 = " failed!  mbedtls_pk_parse_key returned %d\n\n";
        uVar2 = uVar1;
      }
    }
    else {
      pcVar3 = " failed!  mbedtls_x509_crt_parse returned %d\n\n";
      uVar2 = uVar1;
    }
  }
  else {
    pcVar3 = " failed!  mbedtls_ctr_drbg_seed returned %d\n\n";
    uVar2 = uVar1;
  }
LAB_0010f613:
  printf(pcVar3,(ulong)uVar2);
  goto LAB_0010f61a;
  while ((uVar1 & 0xffffff7f) == 0xffff9700) {
LAB_0010f956:
    uVar1 = mbedtls_ssl_handshake(&local_ee8);
    if (uVar1 == 0) {
      printf("pid %d: SSL handshake ok\n",(ulong)uVar2);
      printf("pid %d: Start reading from client.\n");
      fflush(_stdout);
      do {
        memset(local_838,0,0x400);
        uVar1 = mbedtls_ssl_read(&local_ee8,local_838,0x3ff);
      } while ((uVar1 & 0xffffff7f) == 0xffff9700);
      if ((int)uVar1 < 1) {
        if (uVar1 == 0xffffffb0) {
          pcVar3 = "pid %d: connection was reset by peer\n";
        }
        else {
          if (uVar1 != 0xffff8780) {
            printf("pid %d: mbedtls_ssl_read returned %d\n",(ulong)uVar2,(ulong)uVar1);
            goto LAB_0010fa3a;
          }
          pcVar3 = "pid %d: connection was closed gracefully\n";
        }
        printf(pcVar3,(ulong)uVar2);
      }
      else {
        printf("pid %d: %d bytes read\n\n%s",(ulong)uVar2,(ulong)uVar1,local_838);
      }
LAB_0010fa3a:
      printf("pid %d: Start writing to client.\n",(ulong)uVar2);
      fflush(_stdout);
      pcVar3 = mbedtls_ssl_get_ciphersuite(&local_ee8);
      uVar1 = sprintf((char *)local_838,
                      "HTTP/1.0 200 OK\r\nContent-Type: text/html\r\n\r\n<h2>mbed TLS Test Server</h2>\r\n<p>Successful connection using: %s</p>\r\n"
                      ,pcVar3);
      iVar4 = 1;
      do {
        len = (size_t)(int)uVar1;
        while (uVar1 = mbedtls_ssl_write(&local_ee8,local_838,len), (int)uVar1 < 1) {
          if (uVar1 == 0xffffffb0) {
            printf("pid %d: Write failed!  peer closed the connection\n\n",(ulong)uVar2);
            uVar1 = 0xffffffb0;
            goto LAB_0010f61a;
          }
          if ((uVar1 & 0xffffff7f) != 0xffff9700) {
            pcVar3 = "pid %d: Write failed!  mbedtls_ssl_write returned %d\n\n";
            goto LAB_0010fb08;
          }
        }
        printf("pid %d: %d bytes written\n\n%s\n",(ulong)uVar2,(ulong)uVar1,local_838);
        mbedtls_net_usleep(1000000);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0x65);
      mbedtls_ssl_close_notify(&local_ee8);
      goto LAB_0010f61a;
    }
  }
  pcVar3 = "pid %d: SSL handshake failed!  mbedtls_ssl_handshake returned %d\n\n";
LAB_0010fb08:
  printf(pcVar3,(ulong)uVar2,(ulong)uVar1);
LAB_0010f61a:
  mbedtls_net_free(&local_efc);
  mbedtls_net_free(&local_f00);
  mbedtls_x509_crt_free(&local_a60);
  mbedtls_pk_free(&local_ef8);
  mbedtls_ssl_free(&local_ee8);
  mbedtls_ssl_config_free(&local_bd8);
  mbedtls_ctr_drbg_free(&local_d30);
  mbedtls_entropy_free(&local_430);
  return uVar1;
}

Assistant:

int main( void )
{
    int ret, len, cnt = 0, pid;
    mbedtls_net_context listen_fd, client_fd;
    unsigned char buf[1024];
    const char *pers = "ssl_fork_server";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_x509_crt srvcert;
    mbedtls_pk_context pkey;

    mbedtls_net_init( &listen_fd );
    mbedtls_net_init( &client_fd );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
    mbedtls_entropy_init( &entropy );
    mbedtls_pk_init( &pkey );
    mbedtls_x509_crt_init( &srvcert );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    signal( SIGCHLD, SIG_IGN );

    /*
     * 0. Initial seeding of the RNG
     */
    mbedtls_printf( "\n  . Initial seeding of the random generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_ctr_drbg_seed returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1. Load the certificates and private RSA key
     */
    mbedtls_printf( "  . Loading the server cert. and key..." );
    fflush( stdout );

    /*
     * This demonstration program uses embedded test certificates.
     * Instead, you may want to use mbedtls_x509_crt_parse_file() to read the
     * server and CA certificates, as well as mbedtls_pk_parse_keyfile().
     */
    ret = mbedtls_x509_crt_parse( &srvcert, (const unsigned char *) mbedtls_test_srv_crt,
                          mbedtls_test_srv_crt_len );
    if( ret != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_x509_crt_parse returned %d\n\n", ret );
        goto exit;
    }

    ret = mbedtls_x509_crt_parse( &srvcert, (const unsigned char *) mbedtls_test_cas_pem,
                          mbedtls_test_cas_pem_len );
    if( ret != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_x509_crt_parse returned %d\n\n", ret );
        goto exit;
    }

    ret =  mbedtls_pk_parse_key( &pkey, (const unsigned char *) mbedtls_test_srv_key,
                          mbedtls_test_srv_key_len, NULL, 0 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_pk_parse_key returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1b. Prepare SSL configuration
     */
    mbedtls_printf( "  . Configuring SSL..." );
    fflush( stdout );

    if( ( ret = mbedtls_ssl_config_defaults( &conf,
                    MBEDTLS_SSL_IS_SERVER,
                    MBEDTLS_SSL_TRANSPORT_STREAM,
                    MBEDTLS_SSL_PRESET_DEFAULT ) ) != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_ssl_config_defaults returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );
    mbedtls_ssl_conf_dbg( &conf, my_debug, stdout );

    mbedtls_ssl_conf_ca_chain( &conf, srvcert.next, NULL );
    if( ( ret = mbedtls_ssl_conf_own_cert( &conf, &srvcert, &pkey ) ) != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_ssl_conf_own_cert returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 2. Setup the listening TCP socket
     */
    mbedtls_printf( "  . Bind on https://localhost:4433/ ..." );
    fflush( stdout );

    if( ( ret = mbedtls_net_bind( &listen_fd, NULL, "4433", MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_net_bind returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    while( 1 )
    {
        /*
         * 3. Wait until a client connects
         */
        mbedtls_net_init( &client_fd );
        mbedtls_ssl_init( &ssl );

        mbedtls_printf( "  . Waiting for a remote connection ...\n" );
        fflush( stdout );

        if( ( ret = mbedtls_net_accept( &listen_fd, &client_fd,
                                        NULL, 0, NULL ) ) != 0 )
        {
            mbedtls_printf( " failed!  mbedtls_net_accept returned %d\n\n", ret );
            goto exit;
        }

        /*
         * 3.5. Forking server thread
         */

        mbedtls_printf( "  . Forking to handle connection ..." );
        fflush( stdout );

        pid = fork();

        if( pid < 0 )
        {
            mbedtls_printf(" failed!  fork returned %d\n\n", pid );
            goto exit;
        }

        if( pid != 0 )
        {
            mbedtls_printf( " ok\n" );

            if( ( ret = mbedtls_ctr_drbg_reseed( &ctr_drbg,
                                         (const unsigned char *) "parent",
                                         6 ) ) != 0 )
            {
                mbedtls_printf( " failed!  mbedtls_ctr_drbg_reseed returned %d\n\n", ret );
                goto exit;
            }

            continue;
        }

        mbedtls_net_init( &listen_fd );

        pid = getpid();

        /*
         * 4. Setup stuff
         */
        mbedtls_printf( "pid %d: Setting up the SSL data.\n", pid );
        fflush( stdout );

        if( ( ret = mbedtls_ctr_drbg_reseed( &ctr_drbg,
                                     (const unsigned char *) "child",
                                     5 ) ) != 0 )
        {
            mbedtls_printf(
                    "pid %d: SSL setup failed!  mbedtls_ctr_drbg_reseed returned %d\n\n",
                    pid, ret );
            goto exit;
        }

        if( ( ret = mbedtls_ssl_setup( &ssl, &conf ) ) != 0 )
        {
            mbedtls_printf(
                    "pid %d: SSL setup failed!  mbedtls_ssl_setup returned %d\n\n",
                    pid, ret );
            goto exit;
        }

        mbedtls_ssl_set_bio( &ssl, &client_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

        mbedtls_printf( "pid %d: SSL setup ok\n", pid );

        /*
         * 5. Handshake
         */
        mbedtls_printf( "pid %d: Performing the SSL/TLS handshake.\n", pid );
        fflush( stdout );

        while( ( ret = mbedtls_ssl_handshake( &ssl ) ) != 0 )
        {
            if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
            {
                mbedtls_printf(
                        "pid %d: SSL handshake failed!  mbedtls_ssl_handshake returned %d\n\n",
                        pid, ret );
                goto exit;
            }
        }

        mbedtls_printf( "pid %d: SSL handshake ok\n", pid );

        /*
         * 6. Read the HTTP Request
         */
        mbedtls_printf( "pid %d: Start reading from client.\n", pid );
        fflush( stdout );

        do
        {
            len = sizeof( buf ) - 1;
            memset( buf, 0, sizeof( buf ) );
            ret = mbedtls_ssl_read( &ssl, buf, len );

            if( ret == MBEDTLS_ERR_SSL_WANT_READ || ret == MBEDTLS_ERR_SSL_WANT_WRITE )
                continue;

            if( ret <= 0 )
            {
                switch( ret )
                {
                    case MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY:
                        mbedtls_printf( "pid %d: connection was closed gracefully\n", pid );
                        break;

                    case MBEDTLS_ERR_NET_CONN_RESET:
                        mbedtls_printf( "pid %d: connection was reset by peer\n", pid );
                        break;

                    default:
                        mbedtls_printf( "pid %d: mbedtls_ssl_read returned %d\n", pid, ret );
                        break;
                }

                break;
            }

            len = ret;
            mbedtls_printf( "pid %d: %d bytes read\n\n%s", pid, len, (char *) buf );

            if( ret > 0 )
                break;
        }
        while( 1 );

        /*
         * 7. Write the 200 Response
         */
        mbedtls_printf( "pid %d: Start writing to client.\n", pid );
        fflush( stdout );

        len = sprintf( (char *) buf, HTTP_RESPONSE,
                mbedtls_ssl_get_ciphersuite( &ssl ) );

        while( cnt++ < 100 )
        {
            while( ( ret = mbedtls_ssl_write( &ssl, buf, len ) ) <= 0 )
            {
                if( ret == MBEDTLS_ERR_NET_CONN_RESET )
                {
                    mbedtls_printf(
                            "pid %d: Write failed!  peer closed the connection\n\n", pid );
                    goto exit;
                }

                if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
                {
                    mbedtls_printf(
                            "pid %d: Write failed!  mbedtls_ssl_write returned %d\n\n",
                            pid, ret );
                    goto exit;
                }
            }
            len = ret;
            mbedtls_printf( "pid %d: %d bytes written\n\n%s\n", pid, len, (char *) buf );

            mbedtls_net_usleep( 1000000 );
        }

        mbedtls_ssl_close_notify( &ssl );
        goto exit;
    }

exit:
    mbedtls_net_free( &client_fd );
    mbedtls_net_free( &listen_fd );

    mbedtls_x509_crt_free( &srvcert );
    mbedtls_pk_free( &pkey );
    mbedtls_ssl_free( &ssl );
    mbedtls_ssl_config_free( &conf );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}